

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  ImGuiTable *pIVar2;
  ulong uVar3;
  long lVar4;
  ImGuiContext *g;
  undefined8 in_R9;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = (ctx->Tables).Buf.Size;
  uVar3 = (ulong)uVar1;
  if (uVar1 != 0) {
    lVar4 = 0x1d9;
    uVar5 = 0;
    uVar6 = uVar3;
    do {
      if ((long)(int)uVar3 <= (long)uVar5) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size",in_R9,uVar6);
      }
      pIVar2 = (ctx->Tables).Buf.Data;
      *(undefined1 *)((long)&pIVar2->ID + lVar4) = 1;
      *(undefined4 *)((long)pIVar2 + lVar4 + -0x175) = 0xffffffff;
      uVar5 = uVar5 + 1;
      uVar3 = (ulong)(uint)(ctx->Tables).Buf.Size;
      lVar4 = lVar4 + 0x1e0;
    } while (uVar5 != uVar3);
  }
  return;
}

Assistant:

int         GetSize() const                     { return Buf.Size; }